

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O0

void beltKeyExpand(octet *key_,octet *key,size_t len)

{
  long in_RDX;
  uint *in_RDI;
  u32 *w;
  void *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  memMove(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x137207);
  if (in_RDX == 0x10) {
    memCopy(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x137227);
  }
  else if (in_RDX == 0x18) {
    in_RDI[6] = *in_RDI ^ in_RDI[1] ^ in_RDI[2];
    in_RDI[7] = in_RDI[3] ^ in_RDI[4] ^ in_RDI[5];
  }
  return;
}

Assistant:

void beltKeyExpand(octet key_[32], const octet key[], size_t len)
{
	ASSERT(memIsValid(key_, 32));
	ASSERT(len == 16 || len == 24 || len == 32);
	ASSERT(memIsValid(key, len));
	memMove(key_, key, len);
	if (len == 16)
		memCopy(key_ + 16, key_, 16);
	else if (len == 24)
	{
		u32* w = (u32*)key_;
		w[6] = w[0] ^ w[1] ^ w[2];
		w[7] = w[3] ^ w[4] ^ w[5];
	}
}